

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slarnv.c
# Opt level: O3

int slarnv_slu(int *idist,int *iseed,int *n,float *x)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  slarnv_slu::iv = 1;
  iVar2 = *n;
  if (0 < iVar2) {
    do {
      iVar2 = iVar2 - slarnv_slu::iv;
      if (0x3e < iVar2) {
        iVar2 = 0x3f;
      }
      slarnv_slu::il = iVar2 + 1;
      slarnv_slu::il2 = slarnv_slu::il << (*idist == 3);
      slaruv_slu(iseed,&slarnv_slu::il2,slarnv_slu::u);
      iVar2 = *idist;
      if (iVar2 == 1) {
        uVar3 = (ulong)(uint)slarnv_slu::il;
        if (slarnv_slu::il < 1) {
LAB_0010ba89:
          slarnv_slu::i = 1;
        }
        else {
          lVar4 = (long)slarnv_slu::iv;
          slarnv_slu::i = slarnv_slu::il + 1;
          lVar5 = 0;
          do {
            *(undefined4 *)((long)x + lVar5 + lVar4 * 4 + -4) =
                 *(undefined4 *)((long)slarnv_slu::u + lVar5);
            lVar5 = lVar5 + 4;
          } while (uVar3 * 4 != lVar5);
        }
      }
      else if (iVar2 == 2) {
        uVar3 = (ulong)(uint)slarnv_slu::il;
        if (slarnv_slu::il < 1) goto LAB_0010ba89;
        lVar4 = (long)slarnv_slu::iv;
        slarnv_slu::i = slarnv_slu::il + 1;
        lVar5 = 0;
        do {
          *(float *)((long)x + lVar5 + lVar4 * 4 + -4) =
               *(float *)((long)slarnv_slu::u + lVar5) + *(float *)((long)slarnv_slu::u + lVar5) +
               -1.0;
          lVar5 = lVar5 + 4;
        } while (uVar3 * 4 != lVar5);
      }
      else if ((iVar2 == 3) && (slarnv_slu::i = 1, 0 < slarnv_slu::il)) {
        do {
          dVar6 = log((double)*(float *)((long)(slarnv_slu::i * 2) * 4 + 0x12a398));
          dVar6 = dVar6 * -2.0;
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          dVar7 = cos((double)(*(float *)((long)(slarnv_slu::i * 2) * 4 + 0x12a39c) * 6.2831855));
          x[(long)slarnv_slu::iv + (long)slarnv_slu::i + -2] = (float)(dVar7 * dVar6);
          iVar2 = slarnv_slu::i + 1;
          bVar1 = slarnv_slu::i < slarnv_slu::il;
          slarnv_slu::i = iVar2;
        } while (bVar1);
      }
      slarnv_slu::iv = slarnv_slu::iv + 0x40;
      iVar2 = *n;
    } while (slarnv_slu::iv <= iVar2);
  }
  return 0;
}

Assistant:

int slarnv_slu(int *idist, int *iseed, int *n, float
	*x)
{
/*  -- LAPACK auxiliary routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

    SLARNV returns a vector of n random real numbers from a uniform or   
    normal distribution.   

    Arguments   
    =========   

    IDIST   (input) INTEGER   
            Specifies the distribution of the random numbers:   
            = 1:  uniform (0,1)   
            = 2:  uniform (-1,1)   
            = 3:  normal (0,1)   

    ISEED   (input/output) INTEGER array, dimension (4)   
            On entry, the seed of the random number generator; the array 
  
            elements must be between 0 and 4095, and ISEED(4) must be   
            odd.   
            On exit, the seed is updated.   

    N       (input) INTEGER   
            The number of random numbers to be generated.   

    X       (output) REAL array, dimension (N)   
            The generated random numbers.   

    Further Details   
    ===============   

    This routine calls the auxiliary routine SLARUV to generate random   
    real numbers from a uniform (0,1) distribution, in batches of up to   
    128 using vectorisable code. The Box-Muller method is used to   
    transform numbers from a uniform to a normal distribution.   

    ===================================================================== 
  


    
   Parameter adjustments   
       Function Body */
    /* System generated locals */
    int i__2, i__3;
    /* Local variables */
    static int i;
    static float u[128];
    static int il, iv, il2;
    extern /* Subroutine */ int slaruv_slu(int *, int *, float *);


#define X(I) x[(I)-1]
#define ISEED(I) iseed[(I)-1]


    for (iv = 1; iv <= *n; iv += 64) {
/* Computing MIN */
	i__2 = 64, i__3 = *n - iv + 1;
	il = SUPERLU_MIN(i__2,i__3);
	if (*idist == 3) {
	    il2 = il << 1;
	} else {
	    il2 = il;
	}

/*        Call SLARUV to generate IL2 numbers from a uniform (0,1)   
          distribution (IL2 <= LV) */

	slaruv_slu(&ISEED(1), &il2, u);

	if (*idist == 1) {

/*           Copy generated numbers */

	    i__2 = il;
	    for (i = 1; i <= il; ++i) {
		X(iv + i - 1) = u[i - 1];
/* L10: */
	    }
	} else if (*idist == 2) {

/*           Convert generated numbers to uniform (-1,1) distribut
ion */

	    i__2 = il;
	    for (i = 1; i <= il; ++i) {
		X(iv + i - 1) = u[i - 1] * 2.f - 1.f;
/* L20: */
	    }
	} else if (*idist == 3) {

/*           Convert generated numbers to normal (0,1) distributio
n */

	    i__2 = il;
	    for (i = 1; i <= il; ++i) {
		X(iv + i - 1) = sqrt(log(u[(i << 1) - 2]) * -2.f) * cos(u[(i 
			<< 1) - 1] * 6.2831853071795864769252867663f);
/* L30: */
	    }
	}
/* L40: */
    }
    return 0;

/*     End of SLARNV */

}